

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

int16_t __thiscall nuraft::buffer_serializer::get_i16(buffer_serializer *this)

{
  size_t sVar1;
  bool bVar2;
  byte *pbVar3;
  overflow_error *this_00;
  ushort uVar4;
  
  bVar2 = is_valid(this,2);
  if (bVar2) {
    pbVar3 = buffer::data_begin(this->buf_);
    sVar1 = this->pos_;
    if (this->endian_ == LITTLE) {
      uVar4 = *(ushort *)(pbVar3 + sVar1);
    }
    else {
      uVar4 = *(ushort *)(pbVar3 + sVar1) << 8 | *(ushort *)(pbVar3 + sVar1) >> 8;
    }
    pos(this,sVar1 + 2);
    return uVar4;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

int16_t buffer_serializer::get_i16() {
    int16_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get16l(ptr, ret); }
    else                    { get16b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}